

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O3

bool __thiscall PClassPointer::IsMatch(PClassPointer *this,intptr_t id1,intptr_t id2)

{
  PClass *pPVar1;
  PClass *pPVar2;
  bool bVar3;
  
  pPVar1 = PClass::RegistrationInfo.MyClass;
  pPVar2 = *(PClass **)(id1 + 8);
  if (pPVar2 == (PClass *)0x0) {
    pPVar2 = (PClass *)(*(code *)**(undefined8 **)id1)(id1);
    *(PClass **)(id1 + 8) = pPVar2;
  }
  bVar3 = pPVar2 != (PClass *)0x0;
  if (pPVar2 != pPVar1 && bVar3) {
    do {
      pPVar2 = pPVar2->ParentClass;
      bVar3 = pPVar2 != (PClass *)0x0;
      if (pPVar2 == pPVar1) break;
    } while (pPVar2 != (PClass *)0x0);
  }
  if (bVar3) {
    return this->ClassRestriction == (PClass *)id2;
  }
  __assert_fail("pointat->IsKindOf(RUNTIME_CLASS(PClass))",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobjtype.cpp"
                ,0x79e,"virtual bool PClassPointer::IsMatch(intptr_t, intptr_t) const");
}

Assistant:

bool PClassPointer::IsMatch(intptr_t id1, intptr_t id2) const
{
	const PType *pointat = (const PType *)id1;
	const PClass *classat = (const PClass *)id2;

	assert(pointat->IsKindOf(RUNTIME_CLASS(PClass)));
	return classat == ClassRestriction;
}